

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall Handler::DeleteVirtualMachine(Handler *this,int *vmId)

{
  short *psVar1;
  ulong uVar2;
  undefined8 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  pointer pDVar7;
  pointer pVVar8;
  pointer pPVar9;
  pointer pSVar10;
  pointer pVVar11;
  ushort uVar12;
  uint uVar13;
  mapped_type *pmVar14;
  undefined1 auVar15 [16];
  uint32_t deployedVMIdx;
  undefined1 local_24 [4];
  
  pmVar14 = std::__detail::
            _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->idDeployedVMMap,vmId);
  uVar6 = *pmVar14;
  pDVar7 = (this->deployedVMs).
           super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = this->purchasedServerIdxMap[pDVar7[uVar6].purchasedServerId];
  pVVar8 = (this->virtualMachines).
           super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar11 = pVVar8 + pDVar7[uVar6].vmIdx;
  uVar2._0_2_ = pVVar11->cpuCore;
  uVar2._2_2_ = pVVar11->memorySize;
  uVar2._4_1_ = pVVar11->nodeType;
  uVar2._5_3_ = *(undefined3 *)&pVVar11->field_0x25;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  pPVar9 = (this->purchasedServers).
           super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar8[pDVar7[uVar6].vmIdx].nodeType == true) {
    auVar15 = pshuflw(auVar15,auVar15,0x50);
    uVar3 = *(undefined8 *)((long)&pPVar9->remainCpuCoreA + (ulong)((uint)uVar4 * 0x48));
    *(ulong *)((long)&pPVar9->remainCpuCoreA + (ulong)((uint)uVar4 * 0x48)) =
         CONCAT26((short)((ulong)uVar3 >> 0x30) + (auVar15._6_2_ >> 1),
                  CONCAT24((short)((ulong)uVar3 >> 0x20) + (auVar15._4_2_ >> 1),
                           CONCAT22((short)((ulong)uVar3 >> 0x10) + (auVar15._2_2_ >> 1),
                                    (short)uVar3 + (auVar15._0_2_ >> 1))));
  }
  else if (pDVar7[uVar6].location == true) {
    psVar1 = (short *)((long)&pPVar9->remainCpuCoreA + (ulong)((uint)uVar4 * 0x48));
    *psVar1 = *psVar1 + (undefined2)uVar2;
    psVar1 = (short *)((long)&pPVar9->remainMemorySizeA + (ulong)((uint)uVar4 * 0x48));
    *psVar1 = *psVar1 + uVar2._2_2_;
  }
  else {
    psVar1 = (short *)((long)&pPVar9->remainCpuCoreB + (ulong)((uint)uVar4 * 0x48));
    *psVar1 = *psVar1 + (undefined2)uVar2;
    psVar1 = (short *)((long)&pPVar9->remainMemorySizeB + (ulong)((uint)uVar4 * 0x48));
    *psVar1 = *psVar1 + uVar2._2_2_;
  }
  this->deployedVMNum = this->deployedVMNum - 1;
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->idDeployedVMMap)._M_h,vmId);
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->idVirtualMachineMap)._M_h,vmId);
  pSVar10 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = pSVar10[(&pPVar9->serverIdx)[(uint)uVar4 * 0x48]].cpuCore;
  uVar12 = *(short *)((long)&pPVar9->remainCpuCoreB + (ulong)((uint)uVar4 * 0x48)) +
           *(short *)((long)&pPVar9->remainCpuCoreA + (ulong)((uint)uVar4 * 0x48));
  uVar13 = ((uint)(ushort)(*(short *)((long)&pPVar9->remainMemorySizeB + (ulong)((uint)uVar4 * 0x48)
                                     ) +
                          *(short *)((long)&pPVar9->remainMemorySizeA + (ulong)((uint)uVar4 * 0x48))
                          ) + ((uint)uVar12 + (uint)uVar12 * 2) * 4) * 100;
  uVar6 = (uint)pSVar10[(&pPVar9->serverIdx)[(uint)uVar4 * 0x48]].memorySize +
          ((uint)uVar5 + (uint)uVar5 * 2) * 4;
  (&pPVar9->vacancyRate)[(uint)uVar4 * 0x48] = (uint8_t)(uVar13 / uVar6);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)((long)&(pPVar9->deployedVM)._M_h._M_buckets + (ulong)((uint)uVar4 * 0x48)),local_24
             ,(ulong)uVar13 % (ulong)uVar6);
  return;
}

Assistant:

void Handler::DeleteVirtualMachine(const int &vmId) {
    uint32_t deployedVMIdx = idDeployedVMMap[vmId];
    DeployedVirtualMachine &deployedVM = deployedVMs[deployedVMIdx];
    PurchasedServer &purchasedServer = purchasedServers[purchasedServerIdxMap[deployedVM.purchasedServerId]];
    VirtualMachine &vm = virtualMachines[deployedVM.vmIdx];
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (vm.nodeType) {
        purchasedServer.remainCpuCoreA += cpuCore >> 1u;
        purchasedServer.remainCpuCoreB += cpuCore >> 1u;
        purchasedServer.remainMemorySizeA += memorySize >> 1u;
        purchasedServer.remainMemorySizeB += memorySize >> 1u;
    } else {
        if (deployedVM.location) {
            purchasedServer.remainCpuCoreA += cpuCore;
            purchasedServer.remainMemorySizeA += memorySize;
        } else {
            purchasedServer.remainCpuCoreB += cpuCore;
            purchasedServer.remainMemorySizeB += memorySize;
        }
    }

    --deployedVMNum;
    idDeployedVMMap.erase(vmId);
    idVirtualMachineMap.erase(vmId);
    purchasedServer.vacancyRate = CalculateVacancyRate(purchasedServer);
    purchasedServer.deployedVM.erase(deployedVMIdx);
}